

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ssh_ntru_server_free(ecdh_key *dh)

{
  ecdh_keyalg *b;
  
  b = dh[-4].vt;
  smemclr(b,0x5f2);
  safefree(b);
  strbuf_free((strbuf *)dh[-3].vt);
  strbuf_free((strbuf *)dh[-2].vt);
  (**(code **)((dh[-1].vt)->new + 8))();
  safefree(dh + -4);
  return;
}

Assistant:

static void ssh_ntru_server_free(ecdh_key *dh)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);
    ring_free(nk->plaintext, p_LIVE);
    strbuf_free(nk->ciphertext_encoded);
    strbuf_free(nk->confirmation_hash);
    ecdh_key_free(nk->curve25519);
    sfree(nk);
}